

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::call_matcher<bool(int),std::tuple<trompeloeil::wildcard>>::
call_matcher<trompeloeil::wildcard&>
          (call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> *this,char *file,
          unsigned_long line,char *call_string,wildcard *u)

{
  undefined8 local_30;
  
  *(call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> **)(this + 8) = this;
  *(call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> **)(this + 0x10) = this;
  *(char **)(this + 0x18) = file;
  *(unsigned_long *)(this + 0x20) = line;
  *(char **)(this + 0x28) = call_string;
  *(undefined ***)this = &PTR__call_matcher_003d0448;
  *(undefined **)(this + 0x30) = &DAT_003d04b0;
  *(call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> **)(this + 0x40) = this + 0x38;
  *(call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> **)(this + 0x48) = this + 0x38;
  *(undefined ***)(this + 0x38) = &PTR__list_003cea08;
  *(call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> **)(this + 0x58) = this + 0x50;
  *(call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> **)(this + 0x60) = this + 0x50;
  *(undefined ***)(this + 0x50) = &PTR__list_003cea90;
  *(undefined8 *)(this + 0x68) = 0;
  std::make_unique<trompeloeil::sequence_handler<0ul>>();
  *(undefined8 *)(this + 0x70) = local_30;
  this[0x79] = (call_matcher<bool(int),std::tuple<trompeloeil::wildcard>>)0x0;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}